

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint64_t helper_unpack(target_ulong_conflict arg1)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = extract32(arg1,0x17,8);
  uVar5 = 0;
  uVar2 = extract32(arg1,0,0x17);
  if (uVar1 == 0xff) {
    uVar3 = uVar2 << 7;
    uVar4 = 0xff00000000;
  }
  else {
    if (uVar1 == 0 && uVar2 == 0) {
      uVar4 = 0xffffff8100000000;
      goto LAB_00b39f60;
    }
    uVar3 = uVar2 << 7;
    if (uVar2 == 0 || uVar1 != 0) {
      uVar3 = uVar3 | 0x40000000;
      uVar4 = ((ulong)uVar1 << 0x20) - 0x7f00000000;
    }
    else {
      uVar4 = 0xffffff8200000000;
    }
  }
  uVar5 = (ulong)uVar3;
LAB_00b39f60:
  return uVar5 | uVar4;
}

Assistant:

uint64_t helper_unpack(target_ulong arg1)
{
    int32_t fp_exp  = extract32(arg1, 23, 8);
    int32_t fp_frac = extract32(arg1, 0, 23);
    uint64_t ret;
    int32_t int_exp, int_mant;

    if (fp_exp == 255) {
        int_exp = 255;
        int_mant = (fp_frac << 7);
    } else if ((fp_exp == 0) && (fp_frac == 0)) {
        int_exp  = -127;
        int_mant = 0;
    } else if ((fp_exp == 0) && (fp_frac != 0)) {
        int_exp  = -126;
        int_mant = (fp_frac << 7);
    } else {
        int_exp  = fp_exp - 127;
        int_mant = (fp_frac << 7);
        int_mant |= (1 << 30);
    }
    ret = int_exp;
    ret = ret << 32;
    ret |= int_mant;

    return ret;
}